

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_tonextreg(FuncState *fs,ExpDesc *e)

{
  FuncState *in_RSI;
  ExpDesc *in_RDI;
  FuncState *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  BCReg in_stack_ffffffffffffffec;
  
  expr_discharge(in_RSI,(ExpDesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  expr_free(in_RSI,(ExpDesc *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  bcreg_reserve(in_RSI,in_stack_ffffffffffffffec);
  expr_toreg(unaff_retaddr,in_RDI,(BCReg)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

static void expr_tonextreg(FuncState *fs, ExpDesc *e)
{
  expr_discharge(fs, e);
  expr_free(fs, e);
  bcreg_reserve(fs, 1);
  expr_toreg(fs, e, fs->freereg - 1);
}